

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

bool __thiscall PSEngine::basic_movement_resolution(PSEngine *this)

{
  int iVar1;
  PSVector2i PVar2;
  PSVector2i PVar3;
  PSVector2i PVar4;
  long lVar5;
  ulong uVar6;
  element_type *peVar7;
  element_type *peVar8;
  pointer pOVar9;
  undefined8 this_00;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  pointer pCVar13;
  int iVar14;
  element_type *peVar15;
  element_type *peVar16;
  ObjectMoveInfo *elem;
  value_type *__x;
  element_type *peVar17;
  element_type *peVar18;
  _Base_ptr p_Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Rb_tree_header *p_Var20;
  pointer pCVar21;
  _Rb_tree_node_base *p_Var22;
  pointer pOVar23;
  bool bVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  pVar25;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> current_cell_objects_to_move;
  set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
  current_col_layers;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> objects_to_move;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> local_178;
  pointer local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [48];
  undefined8 local_118 [2];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_108 [2];
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> local_f8;
  long *local_e0 [2];
  long local_d0 [2];
  pointer local_c0;
  _Rb_tree_node_base *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar21 = (this->m_current_level).cells.
            super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_c0 = (this->m_current_level).cells.
             super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pCVar21 != local_c0) {
    local_148._40_8_ = this;
    do {
      this_00 = local_148._40_8_;
      local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (value_type *)0x0;
      local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var10 = (pCVar21->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var22 = &(pCVar21->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var10 != p_Var22) {
        local_158 = (pointer)&pCVar21->objects;
        local_b8 = p_Var22;
        do {
          iVar14 = *(int *)&p_Var10[1]._M_left;
          if (iVar14 == 0) {
            if (*(int *)this_00 < 5) {
              peVar8 = (((shared_ptr<PSLogger> *)(this_00 + 8))->
                       super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_118[0] = local_108;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_118,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                         m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                         m_engine_log_cat_abi_cxx11_._M_string_length);
              local_e0[0] = local_d0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e0,
                         "an objec move type is set to none, this should never happen","");
              (*peVar8->_vptr_PSLogger[2])(peVar8,4,local_118,(string *)local_e0);
              if (local_e0[0] != local_d0) {
                operator_delete(local_e0[0],local_d0[0] + 1);
              }
              if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)local_118[0] != local_108) {
                operator_delete((void *)local_118[0],
                                (ulong)((long)&(local_108[0]._M_pi)->_vptr__Sp_counted_base + 1));
              }
              p_Var22 = local_b8;
              if (*(bool *)(this_00 + 4) == true) {
                print_operation_history((PSEngine *)this_00);
              }
            }
          }
          else if (iVar14 != 6) {
            if (iVar14 == 5) {
              *(undefined4 *)&p_Var10[1]._M_left = 6;
            }
            else {
              local_148._0_4_ = 0;
              local_148._4_4_ = 0;
              local_148._16_8_ = (element_type *)0x0;
              local_150 = *(undefined1 (*) [8])&pCVar21->position;
              local_148._8_8_ = *(undefined8 *)(p_Var10 + 1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var10[1]._M_parent);
              bVar24 = get_move_destination_coord
                                 ((PSEngine *)this_00,pCVar21->position,
                                  *(ObjectMoveType *)&p_Var10[1]._M_left,(PSVector2i *)local_148);
              if (!bVar24) {
                if ((element_type *)local_148._16_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_);
                }
                std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector(&local_178);
                goto LAB_0011751f;
              }
              std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                        (&local_178,(value_type *)local_150);
              if ((element_type *)local_148._16_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_);
              }
            }
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          pOVar9 = local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        } while (p_Var10 != p_Var22);
        pCVar13 = local_158;
        for (__x = local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start; local_158 = pCVar13, __x != pOVar9;
            __x = __x + 1) {
          pVar25 = std::
                   _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                   ::equal_range((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                                  *)pCVar13,&__x->obj);
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
          ::_M_erase_aux((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                          *)pCVar13,(_Base_ptr)pVar25.first._M_node,(_Base_ptr)pVar25.second._M_node
                        );
          std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back(&local_f8,__x);
          pCVar13 = local_158;
        }
      }
      std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector(&local_178);
      pOVar9 = local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this = (PSEngine *)local_148._40_8_;
      pCVar21 = pCVar21 + 1;
    } while (pCVar21 != local_c0);
    if (local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pOVar23 = local_f8.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl
                .super__Vector_impl_data._M_start;
      while( true ) {
        PVar2 = pOVar23->destination;
        iVar14 = PVar2.x;
        if ((((iVar14 < 0) || (iVar1 = ((PSVector2i *)((long)this + 0x19c))->x, iVar1 <= iVar14)) ||
            ((long)PVar2 < 0)) ||
           ((*(int *)((long)this + 0x1a0) <= PVar2.y ||
            (pCVar21 = (((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)
                        ((long)this + 0x1a8))->
                       super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>)._M_impl.
                       super__Vector_impl_data._M_start, pCVar21 == (pointer)0x0)))) break;
        iVar14 = iVar1 * PVar2.y + iVar14;
        p_Var12 = pCVar21[iVar14].objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        PVar2 = (PSVector2i)
                (pOVar23->obj).
                super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (p_Var12 != (_Base_ptr)0x0) {
          p_Var20 = &pCVar21[iVar14].objects._M_t._M_impl.super__Rb_tree_header;
          p_Var19 = &p_Var20->_M_header;
          do {
            PVar3.x = p_Var12[1]._M_color;
            PVar3.y = *(int *)&p_Var12[1].field_0x4;
            if ((ulong)PVar3 >= (ulong)PVar2) {
              p_Var19 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[(ulong)PVar3 < (ulong)PVar2];
          } while (p_Var12 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var19 != p_Var20) &&
             (PVar4.x = p_Var19[1]._M_color, PVar4.y = *(int *)&p_Var19[1].field_0x4,
             (ulong)PVar4 <= (ulong)PVar2)) {
            if (*(int *)this < 5) {
              peVar8 = (((shared_ptr<PSLogger> *)((long)this + 8))->
                       super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_90[0] = local_80;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_90,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                         m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                         m_engine_log_cat_abi_cxx11_._M_string_length);
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b0,
                         "this object already exist in the destination cell, basic movement resolution cannot proceed."
                         ,"");
              (*peVar8->_vptr_PSLogger[2])(peVar8,4,local_90,local_b0);
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (local_90[0] != local_80) {
                operator_delete(local_90[0],local_80[0] + 1);
              }
              if (*(bool *)((long)this + 4) == true) goto LAB_001175ff;
            }
            goto LAB_0011751f;
          }
        }
        local_148._0_8_ =
             (pOVar23->obj).
             super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if ((PSVector2i)local_148._0_8_ != (PSVector2i)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_148._0_8_ + 8) = *(_Atomic_word *)(local_148._0_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_148._0_8_ + 8) = *(_Atomic_word *)(local_148._0_8_ + 8) + 1;
          }
        }
        local_148._8_4_ = 6;
        local_150 = (undefined1  [8])PVar2;
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
        ::
        _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                  ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                    *)&pCVar21[iVar14].objects,
                   (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
                   local_150);
        if ((PSVector2i)local_148._0_8_ != (PSVector2i)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_);
        }
        pOVar23 = pOVar23 + 1;
        if (pOVar23 == pOVar9) goto LAB_00117372;
      }
      if (*(int *)this < 5) {
        peVar8 = (((shared_ptr<PSLogger> *)((long)this + 8))->
                 super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                   m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                   m_engine_log_cat_abi_cxx11_._M_string_length);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"should not happen!","");
        (*peVar8->_vptr_PSLogger[2])(peVar8,4,local_50,local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (*(bool *)((long)this + 4) != false) {
LAB_001175ff:
          print_operation_history(this);
        }
      }
LAB_0011751f:
      bVar24 = false;
      goto LAB_00117521;
    }
  }
LAB_00117372:
  pCVar21 = (this->m_current_level).cells.
            super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar13 = (this->m_current_level).cells.
            super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar24 = true;
  if (pCVar21 != pCVar13) {
    local_158 = pCVar13;
    do {
      if (1 < (pCVar21->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
        local_148._8_8_ = (element_type *)0x0;
        local_148._32_8_ = 0;
        local_148._16_8_ = (element_type *)local_148;
        local_148._24_8_ = (element_type *)local_148;
        for (p_Var12 = (pCVar21->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var12 != &(pCVar21->objects)._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          lVar5 = *(long *)(p_Var12 + 1);
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x40);
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00117400:
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00117402:
            uVar11 = 0;
          }
          else {
            iVar14 = this_01->_M_use_count;
            do {
              if (iVar14 == 0) goto LAB_00117400;
              LOCK();
              iVar1 = this_01->_M_use_count;
              bVar24 = iVar14 == iVar1;
              if (bVar24) {
                this_01->_M_use_count = iVar14 + 1;
                iVar1 = iVar14;
              }
              iVar14 = iVar1;
              UNLOCK();
            } while (!bVar24);
            if (this_01->_M_use_count == 0) goto LAB_00117402;
            uVar11 = *(ulong *)(lVar5 + 0x38);
          }
          peVar16 = (element_type *)local_148;
          peVar18 = (element_type *)local_148;
          peVar7 = (element_type *)local_148._8_8_;
          if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
            do {
              peVar15 = peVar7;
              peVar17 = peVar18;
              uVar6 = (peVar15->super_Object).identifier._M_string_length;
              peVar18 = peVar15;
              if (uVar6 < uVar11) {
                peVar18 = peVar17;
              }
              peVar7 = (element_type *)
                       (&(peVar15->super_Object).super_enable_shared_from_this<CompiledGame::Object>
                         ._M_weak_this.
                         super___weak_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount)[uVar6 < uVar11]._M_pi;
            } while (peVar7 != (element_type *)0x0);
            if (peVar18 != (element_type *)local_148) {
              if (uVar6 < uVar11) {
                peVar15 = peVar17;
              }
              peVar16 = peVar18;
              if (uVar11 < (peVar15->super_Object).identifier._M_string_length) {
                peVar16 = (element_type *)local_148;
              }
            }
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (peVar16 != (element_type *)local_148) {
            std::
            _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                         *)local_150);
            goto LAB_0011751f;
          }
          lVar5 = *(long *)(p_Var12 + 1);
          local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)(lVar5 + 0x40);
          if (local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_finish == (value_type *)0x0) {
LAB_001174aa:
            local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
            super__Vector_impl_data._M_start = (value_type *)0x0;
          }
          else {
            iVar14 = ((local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->destination).x;
            do {
              if (iVar14 == 0) {
                local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                goto LAB_001174aa;
              }
              LOCK();
              iVar1 = ((local_178.
                        super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                        super__Vector_impl_data._M_finish)->destination).x;
              bVar24 = iVar14 == iVar1;
              if (bVar24) {
                ((local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->destination).x = iVar14 + 1;
                iVar1 = iVar14;
              }
              iVar14 = iVar1;
              UNLOCK();
            } while (!bVar24);
            if ((local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish == (value_type *)0x0) ||
               (((local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->destination).x == 0))
            goto LAB_001174aa;
            local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)(lVar5 + 0x38);
          }
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
          ::_M_insert_unique<std::shared_ptr<CompiledGame::CollisionLayer>>
                    ((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
                      *)local_150,(shared_ptr<CompiledGame::CollisionLayer> *)&local_178);
          if (local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_finish != (value_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_178.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                     *)local_150);
        pCVar13 = local_158;
      }
      pCVar21 = pCVar21 + 1;
    } while (pCVar21 != pCVar13);
    bVar24 = true;
  }
LAB_00117521:
  std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector(&local_f8);
  return bVar24;
}

Assistant:

bool PSEngine::basic_movement_resolution()
{
    struct ObjectMoveInfo
    {
        PSVector2i origin;
        PSVector2i destination;

        shared_ptr<CompiledGame::PrimaryObject> obj;
    };

    vector<ObjectMoveInfo> objects_to_move;

    for(Cell& cell : m_current_level.cells)
    {
        vector<ObjectMoveInfo> current_cell_objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                if(pair.second == ObjectMoveType::None)
                {
                    PS_LOG_ERROR("an objec move type is set to none, this should never happen");
                    continue;
                }
                ObjectMoveInfo move_info;
                move_info.origin = cell.position;
                move_info.obj = pair.first;

                //if some movement is invalid, the whole basic movement resolution is invalid
                if( !get_move_destination_coord(cell.position,pair.second,move_info.destination))
                {
                    return false;
                }

                current_cell_objects_to_move.push_back(move_info);
            }
        }

        for(const auto& elem :current_cell_objects_to_move)
        {
            cell.objects.erase(elem.obj);

            objects_to_move.push_back(elem);
        }
    }

    for(const auto& move_info : objects_to_move)
    {
        //check if object is not already in cell
        Cell* dest_cell = get_cell_at(move_info.destination);

        if(dest_cell == nullptr)
        {
            PS_LOG_ERROR("should not happen!");
            return false;
        }

        if(dest_cell->objects.find(move_info.obj) != dest_cell->objects.end())
        {
            //moving objects were temporarily removed from the level so only static ones should be detected here
            PS_LOG_ERROR("this object already exist in the destination cell, basic movement resolution cannot proceed.");
            return false;
        }

        dest_cell->objects.insert(make_pair(move_info.obj, ObjectMoveType::Stationary));

    }

    //check if there's no collisions
    for(Cell& cell : m_current_level.cells)
    {
        if(cell.objects.size() <= 1)
        {
            continue;
        }

        set<shared_ptr<CompiledGame::CollisionLayer>> current_col_layers;

        for(auto& pair : cell.objects )
        {
            if( current_col_layers.count(pair.first->collision_layer.lock()) != 0)
            {
                return false; //collision was detected;
            }
            current_col_layers.insert(pair.first->collision_layer.lock());
        }
    }

    return true;
}